

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_validate_value(lysp_ctx *ctx,yang_arg val_type,char *val)

{
  LY_ERR LVar1;
  uint8_t *prefix_00;
  ly_bool first;
  ly_ctx *plVar2;
  uint8_t prefix;
  uint32_t c;
  size_t utf8_char_len;
  uint8_t local_45;
  uint32_t local_44;
  char *local_40;
  size_t local_38;
  
  local_45 = '\0';
  local_40 = val;
  if (val == (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Missing an expected string.");
LAB_0016fbbe:
    LVar1 = LY_EVALID;
  }
  else if (*val == '\0') {
    LVar1 = LY_SUCCESS;
  }
  else {
    first = '\x01';
    do {
      LVar1 = ly_getutf8(&local_40,&local_44,&local_38);
      if (LVar1 != LY_SUCCESS) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar2 = (ly_ctx *)0x0;
        }
        else {
          plVar2 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
                (ulong)(uint)(int)local_40[-local_38]);
        goto LAB_0016fbbe;
      }
      if (val_type - Y_STR_ARG < 2) {
        LVar1 = lysp_check_stringchar(ctx,local_44);
      }
      else {
        if (val_type == Y_PREF_IDENTIF_ARG) {
          prefix_00 = &local_45;
        }
        else {
          prefix_00 = (uint8_t *)0x0;
        }
        LVar1 = lysp_check_identifierchar(ctx,local_44,first,prefix_00);
      }
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      first = '\0';
      LVar1 = LY_SUCCESS;
    } while (*local_40 != '\0');
  }
  return LVar1;
}

Assistant:

static LY_ERR
lysp_stmt_validate_value(struct lysp_ctx *ctx, enum yang_arg val_type, const char *val)
{
    uint8_t prefix = 0;
    ly_bool first = 1;
    uint32_t c;
    size_t utf8_char_len;

    if (!val) {
        if (val_type == Y_MAYBE_STR_ARG) {
            /* fine */
            return LY_SUCCESS;
        }

        LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Missing an expected string.");
        return LY_EVALID;
    }

    while (*val) {
        LY_CHECK_ERR_RET(ly_getutf8(&val, &c, &utf8_char_len),
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, (val)[-utf8_char_len]), LY_EVALID);

        switch (val_type) {
        case Y_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, NULL));
            break;
        case Y_PREF_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, &prefix));
            break;
        case Y_STR_ARG:
        case Y_MAYBE_STR_ARG:
            LY_CHECK_RET(lysp_check_stringchar(ctx, c));
            break;
        }
        first = 0;
    }

    return LY_SUCCESS;
}